

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggressive_dead_code_elim_pass.cpp
# Opt level: O1

void __thiscall
spvtools::opt::AggressiveDCEPass::ProcessLoad(AggressiveDCEPass *this,Function *func,uint32_t varId)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  bool bVar3;
  ulong uVar4;
  __node_base_ptr p_Var5;
  __node_base_ptr p_Var6;
  __hashtable *__h;
  __node_gen_type __node_gen;
  uint local_24;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *local_20;
  
  local_24 = varId;
  bVar3 = IsLocalVar(this,varId,func);
  if (bVar3) {
    uVar1 = (this->live_local_vars_)._M_h._M_bucket_count;
    uVar4 = (ulong)local_24 % uVar1;
    p_Var5 = (this->live_local_vars_)._M_h._M_buckets[uVar4];
    p_Var6 = (__node_base_ptr)0x0;
    if ((p_Var5 != (__node_base_ptr)0x0) &&
       (p_Var2 = p_Var5->_M_nxt, p_Var6 = p_Var5, local_24 != *(uint *)&p_Var5->_M_nxt[1]._M_nxt)) {
      while (p_Var5 = p_Var2, p_Var2 = p_Var5->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
        p_Var6 = (__node_base_ptr)0x0;
        if (((ulong)*(uint *)&p_Var2[1]._M_nxt % uVar1 != uVar4) ||
           (p_Var6 = p_Var5, local_24 == *(uint *)&p_Var2[1]._M_nxt)) goto LAB_00524d64;
      }
      p_Var6 = (__node_base_ptr)0x0;
    }
LAB_00524d64:
    if ((p_Var6 == (__node_base_ptr)0x0) || (p_Var6->_M_nxt == (_Hash_node_base *)0x0)) {
      AddStores(this,func,local_24);
      local_20 = &this->live_local_vars_;
      std::
      _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                (&this->live_local_vars_,
                 (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)&local_24);
    }
  }
  return;
}

Assistant:

void AggressiveDCEPass::ProcessLoad(Function* func, uint32_t varId) {
  // Only process locals
  if (!IsLocalVar(varId, func)) return;
  // Return if already processed
  if (live_local_vars_.find(varId) != live_local_vars_.end()) return;
  // Mark all stores to varId as live
  AddStores(func, varId);
  // Cache varId as processed
  live_local_vars_.insert(varId);
}